

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O1

void __thiscall DBaseStatusBar::DrINumber(DBaseStatusBar *this,int val,int x,int y,int imgBase)

{
  FImageCollection *this_00;
  FTexture *pFVar1;
  uint uVar2;
  int x_00;
  
  uVar2 = 999;
  if (val < 999) {
    uVar2 = val;
  }
  if (val < 0) {
    this_00 = &this->Images;
    if (val < -9) {
      pFVar1 = FImageCollection::operator[](this_00,0);
      x_00 = x + 1;
      y = y + 1;
    }
    else {
      pFVar1 = FImageCollection::operator[](this_00,imgBase - uVar2);
      DrawImage(this,pFVar1,x + 0x12,y,(FRemapTable *)0x0);
      pFVar1 = FImageCollection::operator[](this_00,1);
      x_00 = x + 9;
    }
  }
  else {
    if (99 < val) {
      pFVar1 = FImageCollection::operator[](&this->Images,uVar2 / 100 + imgBase);
      DrawImage(this,pFVar1,x,y,(FRemapTable *)0x0);
    }
    uVar2 = uVar2 % 100;
    if (99 < val || 9 < uVar2) {
      pFVar1 = FImageCollection::operator[](&this->Images,uVar2 / 10 + imgBase);
      DrawImage(this,pFVar1,x + 9,y,(FRemapTable *)0x0);
    }
    pFVar1 = FImageCollection::operator[](&this->Images,uVar2 % 10 + imgBase);
    x_00 = x + 0x12;
  }
  DrawImage(this,pFVar1,x_00,y,(FRemapTable *)0x0);
  return;
}

Assistant:

void DBaseStatusBar::DrINumber (signed int val, int x, int y, int imgBase) const
{
	int oldval;

	if (val > 999)
		val = 999;
	oldval = val;
	if (val < 0)
	{
		if (val < -9)
		{
			DrawImage (Images[imgLAME], x+1, y+1);
			return;
		}
		val = -val;
		DrawImage (Images[imgBase+val], x+18, y);
		DrawImage (Images[imgNEGATIVE], x+9, y);
		return;
	}
	if (val > 99)
	{
		DrawImage (Images[imgBase+val/100], x, y);
	}
	val = val % 100;
	if (val > 9 || oldval > 99)
	{
		DrawImage (Images[imgBase+val/10], x+9, y);
	}
	val = val % 10;
	DrawImage (Images[imgBase+val], x+18, y);
}